

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O1

void PPrintMathML(TidyDocImpl *doc,uint indent,Node *node)

{
  Node *node_00;
  undefined8 extraout_RDX;
  undefined8 uVar1;
  undefined8 extraout_RDX_00;
  Node *node_01;
  
  node_00 = node;
  PPrintTag(doc,4,indent,node);
  uVar1 = extraout_RDX;
  for (node_01 = node->content; node_01 != (Node *)0x0; node_01 = node_01->next) {
    node_00 = node_01;
    prvTidyPPrintTree(doc,4,indent,node_01);
    uVar1 = extraout_RDX_00;
  }
  PPrintEndTag(doc,(uint)node,(uint)uVar1,node_00);
  return;
}

Assistant:

static void PPrintMathML( TidyDocImpl* doc, uint indent, Node *node )
{
    Node *content;
    uint mode = OtherNamespace;

    PPrintTag( doc, mode, indent, node );

    for ( content = node->content; content; content = content->next )
           TY_(PPrintTree)( doc, mode, indent, content );

    PPrintEndTag( doc, mode, indent, node );
}